

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_ftilda(Forth *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Cell local_2c;
  Cell ret;
  double r1;
  double r2;
  double r3;
  Forth *this_local;
  
  requireDStackAvailable(this,3,"F~");
  requireFStackDepth(this,3,"F~");
  dVar1 = ForthStack<double>::getTop(&this->fStack,0);
  ForthStack<double>::pop(&this->fStack);
  dVar2 = ForthStack<double>::getTop(&this->fStack,0);
  ForthStack<double>::pop(&this->fStack);
  dVar3 = ForthStack<double>::getTop(&this->fStack,0);
  ForthStack<double>::pop(&this->fStack);
  local_2c = this->False;
  if (0.0 < dVar1) {
    if (ABS(dVar2 - dVar3) < dVar1) {
      local_2c = this->True;
    }
  }
  else if ((((dVar1 == 0.0) && (!NAN(dVar1))) || ((dVar1 == -0.0 && (!NAN(dVar1))))) &&
          (dVar3 == dVar2)) {
    local_2c = this->True;
  }
  if (dVar1 < 0.0) {
    iVar4 = (int)(dVar3 - dVar2);
    if (iVar4 < 1) {
      iVar4 = -iVar4;
    }
    iVar5 = (int)dVar1;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    iVar6 = (int)dVar3;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    iVar7 = (int)dVar2;
    if (iVar7 < 1) {
      iVar7 = -iVar7;
    }
    if (iVar4 < iVar5 * (iVar6 + iVar7)) {
      local_2c = this->True;
    }
  }
  ForthStack<unsigned_int>::push(&this->dStack,local_2c);
  return;
}

Assistant:

void f_ftilda(){
			REQUIRE_DSTACK_AVAILABLE(3, "F~");
			REQUIRE_FSTACK_DEPTH(3, "F~");
			auto r3 = fStack.getTop(0); fStack.pop();
			auto r2 = fStack.getTop(0); fStack.pop();
			auto r1 = fStack.getTop(0); fStack.pop();
			Cell ret = False;
			if (r3 > 0.0){
				if (fabs(r2 - r1) < r3) ret = True;
			}
			else if ((r3 == 0.0) || (r3 == -0.0)){
				if (memcmp(&r1, &r2,sizeof(r1))==0) 
					ret = True;
			} if (r3 < 0.0){
				if (abs(r1 - r2) < (abs(r3)*(abs(r1) + abs(r2)))) ret = True;
			}
			dStack.push(ret);
		}